

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O3

void UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  void *pvVar4;
  UChar *pUVar5;
  UConverter *pUVar6;
  UConverterSharedData *pUVar7;
  uint uVar8;
  size_t sVar9;
  uint uVar10;
  uint8_t *puVar11;
  char cVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint8_t *puVar17;
  long lVar18;
  int32_t offset;
  long lVar19;
  UChar *pUVar20;
  UConverterToUnicodeArgs subArgs;
  UConverterToUnicodeArgs local_68;
  
  puVar17 = (uint8_t *)args->source;
  pUVar20 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  pvVar4 = args->converter->extraInfo;
  uVar8._0_2_ = args->size;
  uVar8._2_1_ = args->flush;
  uVar8._3_1_ = args->field_0x3;
  uVar10 = 0x38;
  if ((ushort)(undefined2)uVar8 < 0x38) {
    uVar10 = uVar8;
  }
  memcpy(&local_68,args,(ulong)(uVar10 & 0xffff));
  local_68.size = (uint16_t)uVar10;
  iVar15 = *(int *)((long)pvVar4 + 0xa0);
joined_r0x002b0283:
  do {
    if (pbVar3 <= puVar17) goto LAB_002b050f;
    pUVar5 = args->targetLimit;
    if (pUVar5 <= pUVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b050f;
    }
    pUVar6 = args->converter;
    cVar12 = pUVar6->toULength;
    lVar19 = (long)cVar12;
    puVar11 = puVar17;
    if (0 < lVar19) {
      puVar11 = pUVar6->toUBytes;
    }
    if (*puVar11 == 0x1b) {
      lVar13 = 0x35bad1;
      lVar16 = 0;
      do {
        uVar8 = 0x1b;
        lVar18 = 0;
LAB_002b02ce:
        if (lVar18 < lVar19) {
          if (pUVar6->toUBytes[lVar18] != (uint8_t)uVar8) goto LAB_002b030a;
LAB_002b02f1:
          pbVar1 = (byte *)(lVar13 + lVar18);
          uVar8 = (uint)*pbVar1;
          lVar18 = lVar18 + 1;
          if (*pbVar1 == 0) {
            if (*err == U_TRUNCATED_CHAR_FOUND) goto LAB_002b0471;
            iVar15 = (int)lVar16;
            sVar9 = strlen((char *)(escSeqCompoundText + iVar15));
            puVar17 = puVar17 + ((int)sVar9 - (int)cVar12);
            pUVar6->toULength = '\0';
            goto LAB_002b035d;
          }
          goto LAB_002b02ce;
        }
        if (puVar17 + (lVar18 - lVar19) < pbVar3) {
          if ((int)(char)puVar17[lVar18 - lVar19] != uVar8) goto LAB_002b030a;
          goto LAB_002b02f1;
        }
        *err = U_TRUNCATED_CHAR_FOUND;
LAB_002b030a:
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 5;
      } while (lVar16 != 0x14);
      if (*err == U_TRUNCATED_CHAR_FOUND) {
LAB_002b0471:
        if (puVar17 < pbVar3) {
          lVar19 = (long)pbVar3 - (long)puVar17;
          do {
            bVar2 = *puVar17;
            puVar17 = puVar17 + 1;
            pUVar6 = args->converter;
            cVar12 = pUVar6->toULength;
            pUVar6->toULength = cVar12 + '\x01';
            pUVar6->toUBytes[cVar12] = bVar2;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
        *err = U_ZERO_ERROR;
      }
      else {
        puVar17 = puVar17 + (cVar12 == '\0');
        *err = U_ILLEGAL_CHAR_FOUND;
      }
      goto LAB_002b050f;
    }
LAB_002b035d:
    if (iVar15 == 0) {
      if (puVar17 < pbVar3) {
        lVar19 = (long)pbVar3 - (long)puVar17;
        do {
          bVar2 = *puVar17;
          if ((ushort)bVar2 == L'\x1b') break;
          if (pUVar5 <= pUVar20) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
          }
          puVar17 = puVar17 + 1;
          *pUVar20 = (ushort)bVar2;
          pUVar20 = pUVar20 + 1;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      goto joined_r0x002b0283;
    }
    if (puVar17 < pbVar3) {
      uVar8 = (int)pbVar3 - (int)puVar17;
      if (1 < (int)uVar8) {
        uVar14 = 1;
        do {
          if (puVar17[uVar14] == 0x1b) {
            uVar8 = (uint)uVar14;
            break;
          }
          uVar14 = uVar14 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar14);
      }
      local_68.sourceLimit = (char *)(puVar17 + (int)uVar8);
      pUVar7 = (local_68.converter)->sharedData;
      (local_68.converter)->sharedData = *(UConverterSharedData **)((long)pvVar4 + (long)iVar15 * 8)
      ;
      local_68.source = (char *)puVar17;
      local_68.target = pUVar20;
      ucnv_MBCSToUnicodeWithOffsets_63(&local_68,err);
      pUVar20 = local_68.target;
      puVar17 = (uint8_t *)local_68.source;
      (local_68.converter)->sharedData = pUVar7;
      if (U_ZERO_ERROR < *err) {
        if (*err == U_BUFFER_OVERFLOW_ERROR) {
          cVar12 = (local_68.converter)->UCharErrorBufferLength;
          if (0 < (long)cVar12) {
            memcpy(args->converter->UCharErrorBuffer,(local_68.converter)->UCharErrorBuffer,
                   (long)cVar12);
            cVar12 = (local_68.converter)->UCharErrorBufferLength;
          }
          args->converter->UCharErrorBufferLength = cVar12;
          (local_68.converter)->UCharErrorBufferLength = '\0';
        }
LAB_002b050f:
        *(int *)((long)pvVar4 + 0xa0) = iVar15;
        args->target = pUVar20;
        args->source = (char *)puVar17;
        return;
      }
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    const char *tmpSourceLimit = mySourceLimit;
    uint32_t mySourceChar = 0x0000;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    int32_t sourceOffset = 0;
    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) args->converter->extraInfo;
    UConverterSharedData* savedSharedData = NULL;

    UConverterToUnicodeArgs subArgs;
    int32_t minArgsSize;

    /* set up the subconverter arguments */
    if(args->size<sizeof(UConverterToUnicodeArgs)) {
        minArgsSize = args->size;
    } else {
        minArgsSize = (int32_t)sizeof(UConverterToUnicodeArgs);
    }

    uprv_memcpy(&subArgs, args, minArgsSize);
    subArgs.size = (uint16_t)minArgsSize;

    currentState = tmpState =  myConverterData->state;

    while(mySource < mySourceLimit){
        if(myTarget < args->targetLimit){
            if (args->converter->toULength > 0) {
                mySourceChar = args->converter->toUBytes[0];
            } else {
                mySourceChar = (uint8_t)*mySource;
            }

            if (mySourceChar == ESC_START) {
                tmpState = findStateFromEscSeq(mySource, mySourceLimit, args->converter->toUBytes, args->converter->toULength, err);

                if (*err == U_TRUNCATED_CHAR_FOUND) {
                    for (; mySource < mySourceLimit;) {
                        args->converter->toUBytes[args->converter->toULength++] = *mySource++;
                    }
                    *err = U_ZERO_ERROR;
                    break;
                } else if (tmpState == INVALID) {
                    if (args->converter->toULength == 0) {
                        mySource++; /* skip over the 0x1b byte */
                    }
                    *err = U_ILLEGAL_CHAR_FOUND;
                    break;
                }

                if (tmpState != currentState) {
                    currentState = tmpState;
                }

                sourceOffset = static_cast<int32_t>(uprv_strlen((char*)escSeqCompoundText[currentState]) - args->converter->toULength);

                mySource += sourceOffset;

                args->converter->toULength = 0;
            }

            if (currentState == COMPOUND_TEXT_SINGLE_0) {
                while (mySource < mySourceLimit) {
                    if (*mySource == ESC_START) {
                        break;
                    }
                    if (myTarget < args->targetLimit) {
                        *myTarget++ = 0x00ff&(*mySource++);
                    } else {
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            } else if (mySource < mySourceLimit){
                sourceOffset = findNextEsc(mySource, mySourceLimit);

                tmpSourceLimit = mySource + sourceOffset;

                subArgs.source = mySource;
                subArgs.sourceLimit = tmpSourceLimit;
                subArgs.target = myTarget;
                savedSharedData = subArgs.converter->sharedData;
                subArgs.converter->sharedData = myConverterData->myConverterArray[currentState];

                ucnv_MBCSToUnicodeWithOffsets(&subArgs, err);

                subArgs.converter->sharedData = savedSharedData;

                mySource = subArgs.source;
                myTarget = subArgs.target;

                if (U_FAILURE(*err)) {
                    if(*err == U_BUFFER_OVERFLOW_ERROR) {
                        if(subArgs.converter->UCharErrorBufferLength > 0) {
                            uprv_memcpy(args->converter->UCharErrorBuffer, subArgs.converter->UCharErrorBuffer,
                                        subArgs.converter->UCharErrorBufferLength);
                        }
                        args->converter->UCharErrorBufferLength=subArgs.converter->UCharErrorBufferLength;
                        subArgs.converter->UCharErrorBufferLength = 0;
                    }
                    break;
                }
            }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    myConverterData->state = currentState;
    args->target = myTarget;
    args->source = mySource;
}